

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O1

void __thiscall QPrintDialog::QPrintDialog(QPrintDialog *this,QWidget *parent)

{
  QPrintDialogPrivate *this_00;
  
  this_00 = (QPrintDialogPrivate *)operator_new(0x4b8);
  QPrintDialogPrivate::QPrintDialogPrivate(this_00);
  QAbstractPrintDialog::QAbstractPrintDialog
            ((QAbstractPrintDialog *)this,(QAbstractPrintDialogPrivate *)this_00,(QPrinter *)0x0,
             parent);
  *(undefined ***)this = &PTR_metaObject_00167710;
  *(undefined ***)(this + 0x10) = &PTR__QPrintDialog_001678e8;
  QPrintDialogPrivate::init(*(QPrintDialogPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QPrintDialog::QPrintDialog(QWidget *parent)
    : QAbstractPrintDialog(*(new QPrintDialogPrivate), nullptr, parent)
{
    Q_D(QPrintDialog);
    d->init();
}